

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

shared_ptr<ast_refarraydimensions>
dcast<ast_refarraydimensions,ast_nodebase>(shared_ptr<ast_nodebase> *r)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long *in_RSI;
  undefined1 auVar1 [16];
  shared_ptr<ast_refarraydimensions> sVar2;
  
  if (*in_RSI != 0) {
    auVar1 = __dynamic_cast(*in_RSI,&ast_nodebase::typeinfo,&ast_refarraydimensions::typeinfo,0);
    in_RDX._M_pi = auVar1._8_8_;
    if (auVar1._0_8_ != (element_type *)0x0) {
      (r->super___shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = auVar1._0_8_;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
                (&(r->super___shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 1));
      in_RDX._M_pi = extraout_RDX;
      goto LAB_001091ba;
    }
  }
  (r->super___shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (r->super___shared_ptr<ast_nodebase,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001091ba:
  sVar2.super___shared_ptr<ast_refarraydimensions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar2.super___shared_ptr<ast_refarraydimensions,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)r;
  return (shared_ptr<ast_refarraydimensions>)
         sVar2.super___shared_ptr<ast_refarraydimensions,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dcast( const std::shared_ptr<U>& r ) noexcept {
  if (auto p = dynamic_cast<typename std::shared_ptr<T>::element_type*>(r.get())) {
    return std::shared_ptr<T>(r, p);
  } else {
    return std::shared_ptr<T>();
  }
}